

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O3

void ym2612_update_chan<5>::func(tables_t *g,channel_t *ch,sample_t_conflict1 *buf,int length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  undefined1 auVar29 [16];
  int local_104;
  uint local_fc;
  int local_f8;
  int local_f4;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a0;
  int local_9c;
  
  iVar13 = ch->SLOT[3].Ecnt;
  iVar28 = ch->SLOT[1].Ecnt;
  local_f4 = ch->SLOT[2].Ecnt;
  if (local_f4 != 0x20000000 || (iVar28 != 0x20000000 || iVar13 != 0x20000000)) {
    iVar1 = g->LFOinc;
    iVar22 = ch->SLOT[3].Fcnt;
    iVar16 = ch->SLOT[1].Fcnt;
    iVar20 = ch->SLOT[2].Fcnt;
    iVar15 = ch->SLOT[0].Fcnt;
    local_f8 = ch->SLOT[0].Ecnt;
    local_b4 = ch->SLOT[0].Ecmp;
    local_ac = ch->SLOT[0].Einc;
    local_b8 = ch->SLOT[1].Ecmp;
    local_b0 = ch->SLOT[1].Einc;
    local_bc = ch->SLOT[2].Ecmp;
    uVar17 = g->LFOcnt;
    local_c0 = ch->SLOT[2].Einc;
    local_c8 = ch->SLOT[3].Ecmp;
    local_c4 = ch->SLOT[3].Einc;
    local_dc = ch->SLOT[0].env_xor;
    local_cc = ch->SLOT[0].env_max;
    local_e0 = ch->SLOT[2].env_xor;
    local_d0 = ch->SLOT[2].env_max;
    local_e4 = ch->SLOT[1].env_xor;
    local_d4 = ch->SLOT[1].env_max;
    local_e8 = ch->SLOT[3].env_xor;
    local_d8 = ch->SLOT[3].env_max;
    local_9c = ch->SLOT[0].Ecurp;
    uVar14 = ch->SLOT[0].SEG;
    iVar24 = ch->SLOT[1].Ecurp;
    uVar19 = ch->SLOT[1].SEG;
    local_104 = ch->SLOT[2].Ecurp;
    local_fc = ch->SLOT[2].SEG;
    local_a0 = ch->SLOT[3].Ecurp;
    local_ec = ch->SLOT[3].SEG;
    iVar2 = ch->SLOT[3].TLL;
    iVar3 = ch->SLOT[3].AMS;
    iVar4 = ch->FB;
    lVar23 = 0;
    iVar12 = ch->S0_OUT[0];
    iVar7 = ch->S0_OUT[1];
    do {
      iVar27 = iVar12;
      uVar17 = uVar17 + iVar1;
      uVar26 = (ulong)(uVar17 >> 0x11 & 0x7fe);
      iVar18 = (int)*(short *)((long)g->LFO_ENV_TAB + uVar26);
      uVar21 = (int)g->ENV_TAB[local_f8 >> 0x10] + ch->SLOT[0].TLL;
      iVar12 = (iVar18 >> ((byte)ch->SLOT[0].AMS & 0x1f)) + (uVar21 ^ local_dc);
      if (local_cc <= (int)uVar21) {
        iVar12 = 0;
      }
      uVar21 = (int)g->ENV_TAB[local_f4 >> 0x10] + ch->SLOT[2].TLL;
      iVar5 = (iVar18 >> ((byte)ch->SLOT[2].AMS & 0x1f)) + (uVar21 ^ local_e0);
      if (local_d0 <= (int)uVar21) {
        iVar5 = 0;
      }
      uVar21 = (int)g->ENV_TAB[iVar28 >> 0x10] + ch->SLOT[1].TLL;
      iVar6 = (iVar18 >> ((byte)ch->SLOT[1].AMS & 0x1f)) + (uVar21 ^ local_e4);
      if (local_d4 <= (int)uVar21) {
        iVar6 = 0;
      }
      uVar21 = g->ENV_TAB[iVar13 >> 0x10] + iVar2;
      iVar18 = (iVar18 >> ((byte)iVar3 & 0x1f)) + (uVar21 ^ local_e8);
      if (local_d8 <= (int)uVar21) {
        iVar18 = 0;
      }
      iVar5 = g->TL_TAB[(long)iVar5 +
                        (long)*(short *)((long)g->SIN_TAB +
                                        (ulong)((uint)(iVar27 + iVar20) >> 0xd & 0x1ffe))];
      iVar18 = g->TL_TAB[(long)iVar18 +
                         (long)*(short *)((long)g->SIN_TAB +
                                         (ulong)((uint)(iVar22 + iVar27) >> 0xd & 0x1ffe))];
      iVar6 = g->TL_TAB[(long)iVar6 +
                        (long)*(short *)((long)g->SIN_TAB +
                                        (ulong)((uint)(iVar27 + iVar16) >> 0xd & 0x1ffe))];
      iVar12 = g->TL_TAB[(long)iVar12 +
                         (long)*(short *)((long)g->SIN_TAB +
                                         (ulong)((uint)((iVar7 + iVar27 >> ((byte)iVar4 & 0x1f)) +
                                                       iVar15) >> 0xd & 0x1ffe))];
      iVar25 = ((int)*(short *)((long)g->LFO_FREQ_TAB + uVar26) * ch->FMS >> 10) + 0x100;
      iVar7 = ch->SLOT[0].Finc;
      iVar8 = ch->SLOT[2].Finc;
      iVar9 = ch->SLOT[1].Finc;
      iVar10 = ch->SLOT[3].Finc;
      uVar26._0_4_ = ch->LEFT;
      uVar26._4_4_ = ch->RIGHT;
      uVar11 = *(undefined4 *)(buf + lVar23 * 2);
      local_f8 = local_f8 + local_ac;
      ch->SLOT[0].Ecnt = local_f8;
      if (local_b4 <= local_f8) {
        switch(local_9c) {
        case 0:
          local_b4 = ch->SLOT[0].SLL;
          local_ac = ch->SLOT[0].EincD;
          ch->SLOT[0].Einc = local_ac;
          ch->SLOT[0].Ecmp = local_b4;
          ch->SLOT[0].Ecurp = 1;
          ch->SLOT[0].Ecnt = 0x10000000;
          local_f8 = 0x10000000;
          local_9c = 1;
          break;
        case 1:
          local_f8 = ch->SLOT[0].SLL;
          local_ac = ch->SLOT[0].EincS;
          ch->SLOT[0].Ecnt = local_f8;
          ch->SLOT[0].Einc = local_ac;
          ch->SLOT[0].Ecmp = 0x20000000;
          ch->SLOT[0].Ecurp = 2;
          local_b4 = 0x20000000;
          local_9c = 2;
          break;
        case 2:
          if ((uVar14 & 8) != 0) {
            if ((uVar14 & 1) == 0) {
              local_ac = ch->SLOT[0].EincA;
              ch->SLOT[0].Einc = local_ac;
              ch->SLOT[0].Ecmp = 0x10000000;
              ch->SLOT[0].Ecurp = 0;
              ch->SLOT[0].Ecnt = 0;
              local_9c = 0;
              ch->SLOT[0].env_xor = 0;
              ch->SLOT[0].env_max = 0x7fffffff;
              local_b4 = 0x10000000;
              local_cc = 0x7fffffff;
              uVar14 = uVar14 * 2 & 4;
              ch->SLOT[0].SEG = uVar14;
              if (uVar14 == 0) {
                uVar14 = 0;
                local_dc = 0;
              }
              else {
                ch->SLOT[0].env_xor = 0xfff;
                ch->SLOT[0].env_max = 0xfff;
                local_cc = 0xfff;
                local_dc = 0xfff;
              }
              local_f8 = 0;
              break;
            }
            ch->SLOT[0].env_xor = 0;
            ch->SLOT[0].env_max = 0x7fffffff;
            uVar14 = uVar14 * 2 & 4;
            ch->SLOT[0].SEG = uVar14;
            if (uVar14 == 0) {
              uVar14 = 0;
              local_cc = 0x7fffffff;
              local_dc = 0;
            }
            else {
              ch->SLOT[0].env_xor = 0xfff;
              ch->SLOT[0].env_max = 0xfff;
              local_cc = 0xfff;
              local_dc = 0xfff;
            }
          }
        case 3:
          ch->SLOT[0].Ecnt = 0x20000000;
          ch->SLOT[0].Einc = 0;
          ch->SLOT[0].Ecmp = 0x20000001;
          local_f8 = 0x20000000;
          local_b4 = 0x20000001;
          local_ac = 0;
        }
      }
      iVar28 = iVar28 + local_b0;
      ch->SLOT[1].Ecnt = iVar28;
      if (iVar28 < local_b8) goto switchD_006f0f09_default;
      switch(iVar24) {
      case 0:
        local_b8 = ch->SLOT[1].SLL;
        local_b0 = ch->SLOT[1].EincD;
        ch->SLOT[1].Einc = local_b0;
        ch->SLOT[1].Ecmp = local_b8;
        ch->SLOT[1].Ecurp = 1;
        ch->SLOT[1].Ecnt = 0x10000000;
        iVar28 = 0x10000000;
        iVar24 = 1;
        break;
      case 1:
        iVar28 = ch->SLOT[1].SLL;
        local_b0 = ch->SLOT[1].EincS;
        ch->SLOT[1].Ecnt = iVar28;
        ch->SLOT[1].Einc = local_b0;
        ch->SLOT[1].Ecmp = 0x20000000;
        ch->SLOT[1].Ecurp = 2;
        local_b8 = 0x20000000;
        iVar24 = 2;
        break;
      case 2:
        if ((uVar19 & 8) != 0) {
          if ((uVar19 & 1) == 0) {
            local_b0 = ch->SLOT[1].EincA;
            ch->SLOT[1].Einc = local_b0;
            ch->SLOT[1].Ecmp = 0x10000000;
            ch->SLOT[1].Ecurp = 0;
            ch->SLOT[1].Ecnt = 0;
            iVar24 = 0;
            ch->SLOT[1].env_xor = 0;
            ch->SLOT[1].env_max = 0x7fffffff;
            local_b8 = 0x10000000;
            local_d4 = 0x7fffffff;
            uVar19 = uVar19 * 2 & 4;
            ch->SLOT[1].SEG = uVar19;
            if (uVar19 == 0) {
              uVar19 = 0;
              local_e4 = 0;
            }
            else {
              ch->SLOT[1].env_xor = 0xfff;
              ch->SLOT[1].env_max = 0xfff;
              local_d4 = 0xfff;
              local_e4 = 0xfff;
            }
            iVar28 = 0;
            break;
          }
          ch->SLOT[1].env_xor = 0;
          ch->SLOT[1].env_max = 0x7fffffff;
          uVar19 = uVar19 * 2 & 4;
          ch->SLOT[1].SEG = uVar19;
          if (uVar19 == 0) {
            uVar19 = 0;
            local_d4 = 0x7fffffff;
            local_e4 = 0;
          }
          else {
            ch->SLOT[1].env_xor = 0xfff;
            ch->SLOT[1].env_max = 0xfff;
            local_d4 = 0xfff;
            local_e4 = 0xfff;
          }
        }
        goto LAB_006f0fdd;
      case 3:
LAB_006f0fdd:
        ch->SLOT[1].Ecnt = 0x20000000;
        ch->SLOT[1].Einc = 0;
        ch->SLOT[1].Ecmp = 0x20000001;
        iVar28 = 0x20000000;
        local_b8 = 0x20000001;
        local_b0 = 0;
      }
switchD_006f0f09_default:
      local_f4 = local_f4 + local_c0;
      ch->SLOT[2].Ecnt = local_f4;
      if (local_f4 < local_bc) goto switchD_006f109b_default;
      switch(local_104) {
      case 0:
        local_bc = ch->SLOT[2].SLL;
        local_c0 = ch->SLOT[2].EincD;
        ch->SLOT[2].Einc = local_c0;
        ch->SLOT[2].Ecmp = local_bc;
        ch->SLOT[2].Ecurp = 1;
        ch->SLOT[2].Ecnt = 0x10000000;
        local_f4 = 0x10000000;
        local_104 = 1;
        break;
      case 1:
        local_f4 = ch->SLOT[2].SLL;
        local_c0 = ch->SLOT[2].EincS;
        ch->SLOT[2].Ecnt = local_f4;
        ch->SLOT[2].Einc = local_c0;
        ch->SLOT[2].Ecmp = 0x20000000;
        ch->SLOT[2].Ecurp = 2;
        local_bc = 0x20000000;
        local_104 = 2;
        break;
      case 2:
        if ((local_fc & 8) != 0) {
          if ((local_fc & 1) == 0) {
            local_c0 = ch->SLOT[2].EincA;
            ch->SLOT[2].Einc = local_c0;
            ch->SLOT[2].Ecmp = 0x10000000;
            ch->SLOT[2].Ecurp = 0;
            ch->SLOT[2].Ecnt = 0;
            local_104 = 0;
            ch->SLOT[2].env_xor = 0;
            ch->SLOT[2].env_max = 0x7fffffff;
            local_bc = 0x10000000;
            local_d0 = 0x7fffffff;
            local_fc = local_fc * 2 & 4;
            ch->SLOT[2].SEG = local_fc;
            if (local_fc == 0) {
              local_fc = 0;
              local_e0 = 0;
            }
            else {
              ch->SLOT[2].env_xor = 0xfff;
              ch->SLOT[2].env_max = 0xfff;
              local_d0 = 0xfff;
              local_e0 = 0xfff;
            }
            local_f4 = 0;
            break;
          }
          ch->SLOT[2].env_xor = 0;
          ch->SLOT[2].env_max = 0x7fffffff;
          local_fc = local_fc * 2 & 4;
          ch->SLOT[2].SEG = local_fc;
          if (local_fc == 0) {
            local_fc = 0;
            local_d0 = 0x7fffffff;
            local_e0 = 0;
          }
          else {
            ch->SLOT[2].env_xor = 0xfff;
            ch->SLOT[2].env_max = 0xfff;
            local_d0 = 0xfff;
            local_e0 = 0xfff;
          }
        }
        goto LAB_006f1187;
      case 3:
LAB_006f1187:
        ch->SLOT[2].Ecnt = 0x20000000;
        ch->SLOT[2].Einc = 0;
        ch->SLOT[2].Ecmp = 0x20000001;
        local_f4 = 0x20000000;
        local_bc = 0x20000001;
        local_c0 = 0;
      }
switchD_006f109b_default:
      iVar18 = iVar5 + iVar18 + iVar6 >> 0x10;
      iVar13 = iVar13 + local_c4;
      ch->SLOT[3].Ecnt = iVar13;
      if (local_c8 <= iVar13) {
        switch(local_a0) {
        case 0:
          local_c8 = ch->SLOT[3].SLL;
          local_c4 = ch->SLOT[3].EincD;
          ch->SLOT[3].Einc = local_c4;
          ch->SLOT[3].Ecmp = local_c8;
          ch->SLOT[3].Ecurp = 1;
          ch->SLOT[3].Ecnt = 0x10000000;
          iVar13 = 0x10000000;
          local_a0 = 1;
          break;
        case 1:
          iVar13 = ch->SLOT[3].SLL;
          local_c4 = ch->SLOT[3].EincS;
          ch->SLOT[3].Ecnt = iVar13;
          ch->SLOT[3].Einc = local_c4;
          ch->SLOT[3].Ecmp = 0x20000000;
          ch->SLOT[3].Ecurp = 2;
          local_c8 = 0x20000000;
          local_a0 = 2;
          break;
        case 2:
          if ((local_ec & 8) != 0) {
            if ((local_ec & 1) == 0) {
              local_c4 = ch->SLOT[3].EincA;
              ch->SLOT[3].Einc = local_c4;
              ch->SLOT[3].Ecmp = 0x10000000;
              ch->SLOT[3].Ecurp = 0;
              ch->SLOT[3].Ecnt = 0;
              local_a0 = 0;
              ch->SLOT[3].env_xor = 0;
              ch->SLOT[3].env_max = 0x7fffffff;
              local_c8 = 0x10000000;
              local_d8 = 0x7fffffff;
              local_ec = local_ec * 2 & 4;
              ch->SLOT[3].SEG = local_ec;
              if (local_ec == 0) {
                local_ec = 0;
                local_e8 = 0;
              }
              else {
                ch->SLOT[3].env_xor = 0xfff;
                ch->SLOT[3].env_max = 0xfff;
                local_d8 = 0xfff;
                local_e8 = 0xfff;
              }
              iVar13 = 0;
              break;
            }
            ch->SLOT[3].env_xor = 0;
            ch->SLOT[3].env_max = 0x7fffffff;
            local_ec = local_ec * 2 & 4;
            ch->SLOT[3].SEG = local_ec;
            if (local_ec == 0) {
              local_ec = 0;
              local_d8 = 0x7fffffff;
              local_e8 = 0;
            }
            else {
              ch->SLOT[3].env_xor = 0xfff;
              ch->SLOT[3].env_max = 0xfff;
              local_d8 = 0xfff;
              local_e8 = 0xfff;
            }
          }
        case 3:
          ch->SLOT[3].Ecnt = 0x20000000;
          ch->SLOT[3].Einc = 0;
          ch->SLOT[3].Ecmp = 0x20000001;
          iVar13 = 0x20000000;
          local_c8 = 0x20000001;
          local_c4 = 0;
        }
      }
      iVar15 = ((uint)(iVar7 * iVar25) >> 8) + iVar15;
      iVar20 = ((uint)(iVar8 * iVar25) >> 8) + iVar20;
      iVar16 = ((uint)(iVar9 * iVar25) >> 8) + iVar16;
      iVar22 = ((uint)(iVar25 * iVar10) >> 8) + iVar22;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar26 & CONCAT44(iVar18,iVar18);
      ch->S0_OUT[0] = iVar12;
      auVar29 = pshuflw(auVar29,auVar29,0xe8);
      *(uint *)(buf + lVar23 * 2) =
           CONCAT22((short)((uint)uVar11 >> 0x10) + auVar29._2_2_,(short)uVar11 + auVar29._0_2_);
      lVar23 = lVar23 + 1;
      iVar7 = iVar27;
    } while (length != (int)lVar23);
    ch->S0_OUT[1] = iVar27;
    ch->SLOT[0].Fcnt = iVar15;
    ch->SLOT[2].Fcnt = iVar20;
    ch->SLOT[1].Fcnt = iVar16;
    ch->SLOT[3].Fcnt = iVar22;
  }
  return;
}

Assistant:

void ym2612_update_chan<algo>::func( tables_t& g, channel_t& ch,
		Ym2612_Emu::sample_t* buf, int length )
{
	int not_end = ch.SLOT [S3].Ecnt - ENV_END;
	
	// algo is a compile-time constant, so all conditions based on it are resolved
	// during compilation
	
	// special cases
	if ( algo == 7 )
		not_end |= ch.SLOT [S0].Ecnt - ENV_END;
	
	if ( algo >= 5 )
		not_end |= ch.SLOT [S2].Ecnt - ENV_END;
	
	if ( algo >= 4 )
		not_end |= ch.SLOT [S1].Ecnt - ENV_END;
	
	int CH_S0_OUT_1 = ch.S0_OUT [1];
	
	int in0 = ch.SLOT [S0].Fcnt;
	int in1 = ch.SLOT [S1].Fcnt;
	int in2 = ch.SLOT [S2].Fcnt;
	int in3 = ch.SLOT [S3].Fcnt;
	
	int YM2612_LFOinc = g.LFOinc;
	int YM2612_LFOcnt = g.LFOcnt + YM2612_LFOinc;
	
	if ( !not_end )
		return;
	
	do
	{
		// envelope
		int const env_LFO = g.LFO_ENV_TAB [YM2612_LFOcnt >> LFO_LBITS & LFO_MASK];
		
		short const* const ENV_TAB = g.ENV_TAB;
		
	#define CALC_EN( x ) \
		int temp##x = ENV_TAB [ch.SLOT [S##x].Ecnt >> ENV_LBITS] + ch.SLOT [S##x].TLL;  \
		int en##x = ((temp##x ^ ch.SLOT [S##x].env_xor) + (env_LFO >> ch.SLOT [S##x].AMS)) &    \
				((temp##x - ch.SLOT [S##x].env_max) >> 31);
		
		CALC_EN( 0 )
		CALC_EN( 1 )
		CALC_EN( 2 )
		CALC_EN( 3 )
		
		int const* const TL_TAB = g.TL_TAB;
		
	#define SINT( i, o ) (TL_TAB [g.SIN_TAB [(i)] + (o)])
		
		// feedback
		int CH_S0_OUT_0 = ch.S0_OUT [0];
		{
			int temp = in0 + ((CH_S0_OUT_0 + CH_S0_OUT_1) >> ch.FB);
			CH_S0_OUT_1 = CH_S0_OUT_0;
			CH_S0_OUT_0 = SINT( (temp >> SIN_LBITS) & SIN_MASK, en0 );
		}
		
		int CH_OUTd;
		if ( algo == 0 )
		{
			int temp = in1 + CH_S0_OUT_1;
			temp = in2 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 1 )
		{
			int temp = in2 + CH_S0_OUT_1 + SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 2 )
		{
			int temp = in2 + SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + CH_S0_OUT_1 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 3 )
		{
			int temp = in1 + CH_S0_OUT_1;
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 4 )
		{
			int temp = in3 + SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + CH_S0_OUT_1) >> SIN_LBITS) & SIN_MASK, en1 );
			//DO_LIMIT
		}
		else if ( algo == 5 )
		{
			int temp = CH_S0_OUT_1;
			CH_OUTd = SINT( ((in3 + temp) >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + temp) >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( ((in2 + temp) >> SIN_LBITS) & SIN_MASK, en2 );
			//DO_LIMIT
		}
		else if ( algo == 6 )
		{
			CH_OUTd = SINT( (in3 >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + CH_S0_OUT_1) >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			//DO_LIMIT
		}
		else if ( algo == 7 )
		{
			CH_OUTd = SINT( (in3 >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 ) + CH_S0_OUT_1;
			//DO_LIMIT
		}
		
		CH_OUTd >>= MAX_OUT_BITS - output_bits + 2;
		
		// update phase
		unsigned freq_LFO = ((g.LFO_FREQ_TAB [YM2612_LFOcnt >> LFO_LBITS & LFO_MASK] *
				ch.FMS) >> (LFO_HBITS - 1 + 1)) + (1L << (LFO_FMS_LBITS - 1));
		YM2612_LFOcnt += YM2612_LFOinc;
		in0 += (ch.SLOT [S0].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in1 += (ch.SLOT [S1].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in2 += (ch.SLOT [S2].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in3 += (ch.SLOT [S3].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		
		int t0 = buf [0] + (CH_OUTd & ch.LEFT);
		int t1 = buf [1] + (CH_OUTd & ch.RIGHT);
		
		update_envelope( ch.SLOT [0] );
		update_envelope( ch.SLOT [1] );
		update_envelope( ch.SLOT [2] );
		update_envelope( ch.SLOT [3] );
		
		ch.S0_OUT [0] = CH_S0_OUT_0;
		buf [0] = t0;
		buf [1] = t1;
		buf += 2;
	}
	while ( --length );
	
	ch.S0_OUT [1] = CH_S0_OUT_1;
	
	ch.SLOT [S0].Fcnt = in0;
	ch.SLOT [S1].Fcnt = in1;
	ch.SLOT [S2].Fcnt = in2;
	ch.SLOT [S3].Fcnt = in3;
}